

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.c
# Opt level: O1

void take_line(Env *env)

{
  uint uVar1;
  bool bVar2;
  
  bVar2 = (*env->lexer->eof)(env->lexer);
  while ((!bVar2 &&
         ((uVar1 = env->lexer->lookahead, 0xd < uVar1 || ((0x3400U >> (uVar1 & 0x1f) & 1) == 0)))))
  {
    advance(env);
    bVar2 = (*env->lexer->eof)(env->lexer);
  }
  return;
}

Assistant:

static void take_line(Env *env) {
  while (not_eof(env) && !is_newline(PEEK)) S_ADVANCE;
}